

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O0

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::DecodeString
          (string *__return_storage_ptr__,NumericCharacterEntity *this,string *s)

{
  ulong uVar1;
  char *pcVar2;
  string local_70;
  char local_49;
  ulong uStack_48;
  char c;
  size_t i;
  size_t length;
  allocator<char> local_21;
  string *local_20;
  string *s_local;
  NumericCharacterEntity *this_local;
  
  local_20 = s;
  s_local = (string *)this;
  this_local = (NumericCharacterEntity *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    i = std::__cxx11::string::length();
    for (uStack_48 = 0; uStack_48 < i; uStack_48 = uStack_48 + 1) {
      pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
      local_49 = *pcVar2;
      if ((local_49 == '&') && (uStack_48 < i - 3)) {
        std::__cxx11::string::string((string *)&local_70,(string *)s);
        DecodeRemaining(__return_storage_ptr__,this,&local_70,uStack_48);
        std::__cxx11::string::~string((string *)&local_70);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_21);
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectFormatter::NumericCharacterEntity::DecodeString(std::string s)
{
    if (s.empty())
    {
        return "";
    }

    size_t length = s.length();

    for (size_t i = 0; i < length; i++)
    {
        char c = s.at(i);

        if (c == '&' && i < length - 3)
        {
            return DecodeRemaining(s, i);
        }
    }

    return s;
}